

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_bitstream.c
# Opt level: O0

void test_bitstream_r_3(void)

{
  int iVar1;
  undefined1 local_10 [8];
  uint64_t result;
  
  cunit_start_test("test_bitstream_r_3");
  bitstream_r_init(&_stream_r,buffer,3);
  iVar1 = bitstream_r_read(&_stream_r,local_10,0x19);
  cunit_named_check(iVar1 != 0,"test_bitstream_r_3",0x7c,"should fail reading 57 bits");
  cunit_end_test("test_bitstream_r_3");
  return;
}

Assistant:

static void
test_bitstream_r_3(void) {
  uint64_t result;

  START_TEST();

  bitstream_r_init(&_stream_r, buffer, 3);

  /* try to read 24 bits */
  CHECK_TRUE(bitstream_r_read(&_stream_r, &result, 25), "should fail reading 57 bits");

  END_TEST();
}